

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunmatrix_dense.c
# Opt level: O3

int check_matrix(SUNMatrix A,SUNMatrix B,sunrealtype tol)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  
  lVar3 = SUNDenseMatrix_Data();
  lVar4 = SUNDenseMatrix_Data(B);
  lVar5 = SUNDenseMatrix_LData(A);
  lVar6 = SUNDenseMatrix_LData(B);
  if (lVar5 == lVar6) {
    if (lVar5 < 1) {
      uVar2 = 0;
    }
    else {
      lVar6 = 0;
      iVar7 = 0;
      do {
        iVar1 = SUNRCompareTol(*(undefined8 *)(lVar3 + lVar6 * 8),*(undefined8 *)(lVar4 + lVar6 * 8)
                               ,tol);
        iVar7 = iVar7 + iVar1;
        lVar6 = lVar6 + 1;
      } while (lVar5 != lVar6);
      uVar2 = (uint)(0 < iVar7);
    }
  }
  else {
    puts(">>> ERROR: check_matrix: Different data array lengths ");
    uVar2 = 1;
  }
  return uVar2;
}

Assistant:

int check_matrix(SUNMatrix A, SUNMatrix B, sunrealtype tol)
{
  int failure = 0;
  sunrealtype *Adata, *Bdata;
  sunindextype Aldata, Bldata;
  sunindextype i;

  /* get data pointers */
  Adata = SUNDenseMatrix_Data(A);
  Bdata = SUNDenseMatrix_Data(B);

  /* get and check data lengths */
  Aldata = SUNDenseMatrix_LData(A);
  Bldata = SUNDenseMatrix_LData(B);

  if (Aldata != Bldata)
  {
    printf(">>> ERROR: check_matrix: Different data array lengths \n");
    return (1);
  }

  /* compare data */
  for (i = 0; i < Aldata; i++)
  {
    failure += SUNRCompareTol(Adata[i], Bdata[i], tol);
  }

  if (failure > ZERO) { return (1); }
  else { return (0); }
}